

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

int http1_on_header(http1_parser_s *parser,char *name,size_t name_len,char *data,size_t data_len)

{
  FIOBJ FVar1;
  uint8_t *puVar2;
  size_t sVar3;
  FIOBJ key;
  FIOBJ obj;
  FIOBJ FVar4;
  FIOBJ FVar5;
  fiobj_type_enum type;
  size_t i;
  ulong pos;
  
  FVar1 = parser[3].state.content_length;
  if (FVar1 == 0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (http1 parse ordering error) missing HashMap for header %s: %s",name,
                     data);
    }
    http_send_error2(500,(intptr_t)parser[-1].state.next,
                     *(http_settings_s **)&parser[-1].state.reserved);
  }
  else {
    puVar2 = parser[4].state.next + data_len + name_len;
    parser[4].state.next = puVar2;
    if ((puVar2 < (uint8_t *)parser[4].state.read) &&
       (sVar3 = fiobj_hash_count(FVar1), sVar3 < 0x81)) {
      key = fiobj_str_new(name,name_len);
      obj = fiobj_str_new(data,data_len);
      FVar1 = parser[3].state.content_length;
      FVar5 = key;
      FVar4 = fiobj_hash_replace(FVar1,key,obj);
      type = (fiobj_type_enum)FVar5;
      if (FVar4 != 0) {
        if (obj == 0) {
          fiobj_free(FVar4);
        }
        else {
          sVar3 = fiobj_type_is(FVar4,type);
          FVar5 = FVar4;
          if (sVar3 == 0) {
            FVar5 = fiobj_ary_new();
            fiobj_ary_push(FVar5,FVar4);
            type = (fiobj_type_enum)FVar4;
          }
          sVar3 = fiobj_type_is(obj,type);
          if (sVar3 == 0) {
            fiobj_ary_push(FVar5,obj);
            fiobj_hash_replace(FVar1,key,FVar5);
          }
          else {
            for (pos = 0; sVar3 = fiobj_ary_count(obj), pos < sVar3; pos = pos + 1) {
              FVar4 = fiobj_ary_index(obj,pos);
              fiobj_dup(FVar4);
              fiobj_ary_push(FVar5,FVar4);
            }
            fiobj_hash_set(FVar1,key,FVar5);
          }
        }
      }
      fiobj_free(key);
      return 0;
    }
    if ((*(char *)(*(long *)&parser[-1].state.reserved + 0x7a) != '\0') && (2 < FIO_LOG_LEVEL)) {
      FIO_LOG2STDERR("WARNING: (HTTP) security alert - header flood detected.");
    }
    http_send_error((http_s *)(parser + 1),0x19d);
  }
  return -1;
}

Assistant:

static int http1_on_header(http1_parser_s *parser, char *name, size_t name_len,
                           char *data, size_t data_len) {
  FIOBJ sym;
  FIOBJ obj;
  if (!http1_pr2handle(parser2http(parser)).headers) {
    FIO_LOG_ERROR("(http1 parse ordering error) missing HashMap for header "
                  "%s: %s",
                  name, data);
    http_send_error2(500, parser2http(parser)->p.uuid,
                     parser2http(parser)->p.settings);
    return -1;
  }
  parser2http(parser)->header_size += name_len + data_len;
  if (parser2http(parser)->header_size >=
          parser2http(parser)->max_header_size ||
      fiobj_hash_count(http1_pr2handle(parser2http(parser)).headers) >
          HTTP_MAX_HEADER_COUNT) {
    if (parser2http(parser)->p.settings->log) {
      FIO_LOG_WARNING("(HTTP) security alert - header flood detected.");
    }
    http_send_error(&http1_pr2handle(parser2http(parser)), 413);
    return -1;
  }
  sym = fiobj_str_new(name, name_len);
  obj = fiobj_str_new(data, data_len);
  set_header_add(http1_pr2handle(parser2http(parser)).headers, sym, obj);
  fiobj_free(sym);
  return 0;
}